

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_summon(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  ulong uVar1;
  bool bVar2;
  CHAR_DATA *in_RDX;
  int in_ESI;
  __type_conflict2 _Var3;
  char_data **in_stack_00000038;
  _func_void_char_data_ptr_char_data_ptr *in_stack_00000040;
  string *in_stack_00000048;
  string *in_stack_00000050;
  int in_stack_0000005c;
  CQueue *in_stack_00000060;
  char_data **in_stack_00000070;
  CHAR_DATA *victim;
  char *in_stack_00002310;
  CHAR_DATA *in_stack_00002318;
  CHAR_DATA *in_stack_ffffffffffffff08;
  CHAR_DATA **arg2;
  undefined4 in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  CHAR_DATA *in_stack_ffffffffffffff18;
  CHAR_DATA *ch_00;
  CHAR_DATA *in_stack_ffffffffffffff20;
  allocator<char> *format;
  CHAR_DATA *in_stack_ffffffffffffff28;
  allocator<char> *in_stack_ffffffffffffff40;
  int dam_type;
  CHAR_DATA *victim_00;
  int level_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined1 local_81 [56];
  allocator<char> local_49;
  string local_48 [32];
  CHAR_DATA *local_28 [3];
  CHAR_DATA *local_10;
  int local_8;
  
  local_10 = in_RDX;
  local_8 = in_ESI;
  local_28[0] = get_char_world(in_stack_00002318,in_stack_00002310);
  if (((((local_28[0] != (CHAR_DATA *)0x0) && (local_28[0] != local_10)) &&
       (local_28[0]->in_room != (ROOM_INDEX_DATA *)0x0)) &&
      (((bVar2 = is_npc(in_stack_ffffffffffffff08), bVar2 ||
        (local_28[0]->in_room->area == local_10->in_room->area)) &&
       ((uVar1 = local_10->in_room->room_flags[0], _Var3 = std::pow<int,int>(0,0x61b05e),
        (uVar1 & (long)_Var3) == 0 &&
        ((uVar1 = local_10->in_room->room_flags[0], _Var3 = std::pow<int,int>(0,0x61b09f),
         (uVar1 & (long)_Var3) == 0 && (local_10->in_room->guild == 0)))))))) &&
     (((local_28[0]->in_room->guild == 0 &&
       (((bVar2 = is_npc(in_stack_ffffffffffffff08), !bVar2 ||
         (bVar2 = is_affected_by(in_stack_ffffffffffffff18,in_stack_ffffffffffffff14), !bVar2)) ||
        (local_28[0]->in_room->area == local_10->in_room->area)))) &&
      ((uVar1 = local_28[0]->in_room->room_flags[0], _Var3 = std::pow<int,int>(0,0x61b175),
       (uVar1 & (long)_Var3) == 0 &&
       (uVar1 = local_28[0]->in_room->room_flags[0], _Var3 = std::pow<int,int>(0,0x61b1b6),
       (uVar1 & (long)_Var3) == 0)))))) {
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           local_28[0]->in_room->room_flags[0];
    _Var3 = std::pow<int,int>(0,0x61b1f7);
    if (((ulong)this & (long)_Var3) == 0) {
      victim_00 = (CHAR_DATA *)local_28[0]->in_room->room_flags[0];
      _Var3 = std::pow<int,int>(0,0x61b238);
      if (((ulong)victim_00 & (long)_Var3) == 0) {
        bVar2 = is_npc(in_stack_ffffffffffffff08);
        if (bVar2) {
          in_stack_ffffffffffffff40 = (allocator<char> *)local_28[0]->act[0];
          _Var3 = std::pow<int,int>(0,0x61b285);
          if (((ulong)in_stack_ffffffffffffff40 & (long)_Var3) != 0) goto LAB_0061b4a7;
        }
        bVar2 = is_npc(in_stack_ffffffffffffff08);
        if (((((!bVar2) || ((int)local_28[0]->level < local_8 + 10)) &&
             ((bVar2 = is_npc(in_stack_ffffffffffffff08), bVar2 ||
              ((local_28[0]->level < 0x34 || (bVar2 = is_immortal(in_stack_ffffffffffffff08), bVar2)
               ))))) &&
            ((local_28[0]->fighting == (CHAR_DATA *)0x0 &&
             ((bVar2 = is_npc(in_stack_ffffffffffffff08), !bVar2 ||
              (uVar1 = local_28[0]->imm_flags[0], _Var3 = std::pow<int,int>(0,0x61b351),
              (uVar1 & (long)_Var3) == 0)))))) &&
           (((bVar2 = is_npc(in_stack_ffffffffffffff08), !bVar2 ||
             (local_28[0]->pIndexData->pShop == (SHOP_DATA *)0x0)) &&
            ((bVar2 = is_npc(in_stack_ffffffffffffff08), !bVar2 ||
             (uVar1 = local_28[0]->act[0], _Var3 = std::pow<int,int>(0,0x61b3c8),
             (uVar1 & (long)_Var3) == 0)))))) {
          bVar2 = is_npc(in_stack_ffffffffffffff08);
          if ((!bVar2) &&
             (bVar2 = can_pk(in_stack_ffffffffffffff18,
                             (CHAR_DATA *)
                             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)), !bVar2)
             ) {
            in_stack_ffffffffffffff28 = (CHAR_DATA *)local_28[0]->act[0];
            _Var3 = std::pow<int,int>(0,0x61b42c);
            if (((ulong)in_stack_ffffffffffffff28 & (long)_Var3) != 0) goto LAB_0061b4a7;
          }
          bVar2 = can_see(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
          if ((((bVar2) &&
               (bVar2 = is_explore((ROOM_INDEX_DATA *)in_stack_ffffffffffffff18), !bVar2)) &&
              (bVar2 = is_explore((ROOM_INDEX_DATA *)in_stack_ffffffffffffff18), !bVar2)) &&
             (bVar2 = is_affected(local_28[0],(int)gsn_bind_feet), !bVar2)) {
            bVar2 = is_affected_by(in_stack_ffffffffffffff18,in_stack_ffffffffffffff14);
            if (bVar2) {
              send_to_char((char *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
              return;
            }
            bVar2 = saves_spell((int)this,victim_00,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20))
            ;
            if (!bVar2) {
              format = &local_49;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (this,(char *)victim_00,in_stack_ffffffffffffff40);
              ch_00 = (CHAR_DATA *)local_81;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (this,(char *)victim_00,in_stack_ffffffffffffff40);
              level_00 = (int)this;
              dam_type = (int)((ulong)in_stack_ffffffffffffff40 >> 0x20);
              arg2 = local_28;
              CQueue::AddToQueue<void(*)(char_data*,char_data*),char_data*&,char_data*&>
                        (in_stack_00000060,in_stack_0000005c,in_stack_00000050,in_stack_00000048,
                         in_stack_00000040,in_stack_00000038,in_stack_00000070);
              std::__cxx11::string::~string((string *)(local_81 + 1));
              std::allocator<char>::~allocator((allocator<char> *)local_81);
              std::__cxx11::string::~string(local_48);
              std::allocator<char>::~allocator(&local_49);
              act((char *)format,ch_00,
                  (void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),arg2,0);
              bVar2 = saves_spell(level_00,victim_00,dam_type);
              if (!bVar2) {
                return;
              }
              send_to_char((char *)format,ch_00);
              return;
            }
            act((char *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                (void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                in_stack_ffffffffffffff08,0);
            bVar2 = saves_spell((int)this,victim_00,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20))
            ;
            if (!bVar2) {
              return;
            }
            send_to_char((char *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
            return;
          }
        }
      }
    }
  }
LAB_0061b4a7:
  send_to_char((char *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  return;
}

Assistant:

void spell_summon(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim;

	victim = get_char_world(ch, target_name);

	if (victim == nullptr
		|| victim == ch
		|| victim->in_room == nullptr
		|| (!is_npc(victim) && victim->in_room->area != ch->in_room->area)
		|| IS_SET(ch->in_room->room_flags, ROOM_SAFE)
		|| IS_SET(ch->in_room->room_flags, ROOM_NO_SUMMON_TO)
		|| ch->in_room->guild != 0
		|| victim->in_room->guild != 0
		|| (is_npc(victim) && is_affected_by(victim, AFF_CHARM) && victim->in_room->area != ch->in_room->area)
		|| IS_SET(victim->in_room->room_flags, ROOM_SAFE)
		|| IS_SET(victim->in_room->room_flags, ROOM_PRIVATE)
		|| IS_SET(victim->in_room->room_flags, ROOM_SOLITARY)
		|| IS_SET(victim->in_room->room_flags, ROOM_NO_SUMMON_FROM)
		|| (is_npc(victim) && IS_SET(victim->act, ACT_AGGRESSIVE))
		|| (is_npc(victim) && victim->level >= (level + 10))
		|| (!is_npc(victim) && victim->level >= LEVEL_IMMORTAL && !is_immortal(ch))
		|| victim->fighting != nullptr
		|| (is_npc(victim) && IS_SET(victim->imm_flags, IMM_SUMMON))
		|| (is_npc(victim) && victim->pIndexData->pShop != nullptr)
		|| (is_npc(victim) && IS_SET(victim->act, ACT_AGGRESSIVE))
		|| (!is_npc(victim) && !can_pk(ch, victim) && IS_SET(victim->act, PLR_NOSUMMON))
		|| !can_see(ch, victim)
		|| is_explore(ch->in_room)
		|| is_explore(victim->in_room)
		|| is_affected(victim, gsn_bind_feet))
	{
		send_to_char("You failed.\n\r", ch);
		return;
	}

	if (is_affected_by(ch, AFF_RAGE))
	{
		send_to_char("You lack the concentration to summon while in a rage.\n\r", ch);
		return;
	}

	if (saves_spell(level + 1, victim, DAM_OTHER))
	{
		act("$N resisted your summoning.", ch, 0, victim, TO_CHAR);

		if (saves_spell(level - 1, victim, DAM_OTHER))
			send_to_char("You feel a strange wrenching sensation, but it passes.\n\r", victim);

		return;
	}

	RS.Queue.AddToQueue(3, "spell_summon", "summon_char", summon_char, ch, victim);

	act("You begin the summoning of $N.", ch, 0, victim, TO_CHAR);

	if (saves_spell(level, victim, DAM_OTHER))
		send_to_char("You feel a strange wrenching sensation at the very core of your being.\n\r", victim);
}